

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep_io.c
# Opt level: O0

int MRIStepGetWorkSpace(void *arkode_mem,long *lenrw,long *leniw)

{
  long *in_RDX;
  long *in_RSI;
  int retval;
  ARKodeMRIStepMem step_mem;
  ARKodeMem ark_mem;
  uint in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  long *in_stack_ffffffffffffffd0;
  void *in_stack_ffffffffffffffd8;
  int local_4;
  
  local_4 = mriStep_AccessStepMem
                      (in_stack_ffffffffffffffd8,(char *)in_stack_ffffffffffffffd0,
                       (ARKodeMem *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                       (ARKodeMRIStepMem *)0xee5bee);
  if ((local_4 == 0) &&
     (local_4 = arkGetWorkSpace(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                                (long *)(ulong)in_stack_ffffffffffffffc8), local_4 == 0)) {
    *in_RSI = *(long *)(in_stack_ffffffffffffffd0[0x2a] + 0x50) + *in_RSI;
    *in_RDX = *(long *)(in_stack_ffffffffffffffd0[0x2a] + 0x58) + *in_RDX;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int MRIStepGetWorkSpace(void *arkode_mem, long int *lenrw, long int *leniw)
{
  ARKodeMem ark_mem;
  ARKodeMRIStepMem step_mem;
  int retval;

  /* access ARKodeMRIStepMem structure */
  retval = mriStep_AccessStepMem(arkode_mem, "MRIStepGetLastInnerStepFlag",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) return(retval);

  /* Get ARKODE workspace */
  retval = arkGetWorkSpace(arkode_mem, lenrw, leniw);
  if (retval) return retval;

  /* Get the inner stepper workspace */
  *lenrw += step_mem->stepper->lrw;
  *leniw += step_mem->stepper->liw;

  return(ARK_SUCCESS);
}